

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

bool __thiscall
wasm::WasmBinaryBuilder::maybeVisitStringIterNext
          (WasmBinaryBuilder *this,Expression **out,uint32_t code)

{
  Expression *ref;
  StringIterNext *pSVar1;
  Builder local_28;
  
  if (code == 0xa1) {
    ref = popNonVoidExpression(this);
    local_28.wasm = this->wasm;
    pSVar1 = Builder::makeStringIterNext(&local_28,ref);
    *out = (Expression *)pSVar1;
  }
  return code == 0xa1;
}

Assistant:

bool WasmBinaryBuilder::maybeVisitStringIterNext(Expression*& out,
                                                 uint32_t code) {
  if (code != BinaryConsts::StringViewIterNext) {
    return false;
  }
  auto* ref = popNonVoidExpression();
  out = Builder(wasm).makeStringIterNext(ref);
  return true;
}